

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O1

void * override_EGL_eglGetProcAddress(char *name)

{
  int iVar1;
  void *pvVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  iVar1 = strncmp(name,"gl",2);
  if (((iVar1 != 0) || (pvVar2 = wrapped_dlsym("GLES2",name), pvVar2 == (void *)0x0)) &&
     ((iVar1 = strncmp(name,"egl",3), iVar1 != 0 ||
      (pvVar2 = wrapped_dlsym("EGL",name), pvVar2 == (void *)0x0)))) {
    pvVar2 = dlwrap_real_dlopen("libEGL.so.1",1);
    UNRECOVERED_JUMPTABLE = (code *)dlwrap_real_dlsym(pvVar2,"eglGetProcAddress");
    pvVar2 = (void *)(*UNRECOVERED_JUMPTABLE)(name);
    return pvVar2;
  }
  return pvVar2;
}

Assistant:

void *
override_EGL_eglGetProcAddress(const char *name)
{
    void *symbol;

    if (!STRNCMP_LITERAL(name, "gl")) {
        symbol = wrapped_dlsym("GLES2", name);
        if (symbol)
            return symbol;
    }

    if (!STRNCMP_LITERAL(name, "egl")) {
        symbol = wrapped_dlsym("EGL", name);
        if (symbol)
            return symbol;
    }

    return DEFER_TO_GL("libEGL.so.1", override_EGL_eglGetProcAddress,
                       "eglGetProcAddress", (name));
}